

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QPixmapStylePixmap * __thiscall
QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
          (QPixmapStylePixmap *__return_storage_ptr__,
          QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *this,ControlPixmap *key)

{
  QPixmapStylePixmap *pQVar1;
  
  pQVar1 = valueImpl<QPixmapStyle::ControlPixmap>(this,key);
  if (pQVar1 == (QPixmapStylePixmap *)0x0) {
    *(undefined8 *)&__return_storage_ptr__->field_0x10 = 0;
    (__return_storage_ptr__->margins).m_left = 0;
    (__return_storage_ptr__->margins).m_top = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0;
    (__return_storage_ptr__->margins).m_right = 0;
    (__return_storage_ptr__->margins).m_bottom = 0;
    QPixmapStylePixmap::QPixmapStylePixmap(__return_storage_ptr__);
  }
  else {
    QPixmapStylePixmap::QPixmapStylePixmap(__return_storage_ptr__,pQVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }